

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O0

void __thiscall CVmVarHeapHybrid::~CVmVarHeapHybrid(CVmVarHeapHybrid *this)

{
  _func_int **pp_Var1;
  CVmVarHeap *in_RDI;
  CVmVarHeapHybrid_array *nxt;
  size_t i;
  _func_int **local_10;
  
  in_RDI->_vptr_CVmVarHeap = (_func_int **)&PTR__CVmVarHeapHybrid_00447688;
  for (local_10 = (_func_int **)0x0; local_10 < in_RDI[3]._vptr_CVmVarHeap;
      local_10 = (_func_int **)((long)local_10 + 1)) {
    if (in_RDI[2]._vptr_CVmVarHeap[(long)local_10] != (_func_int *)0x0) {
      (**(code **)(*(long *)in_RDI[2]._vptr_CVmVarHeap[(long)local_10] + 8))();
    }
  }
  free(in_RDI[2]._vptr_CVmVarHeap);
  while (in_RDI[1]._vptr_CVmVarHeap != (_func_int **)0x0) {
    pp_Var1 = (_func_int **)*in_RDI[1]._vptr_CVmVarHeap;
    free(in_RDI[1]._vptr_CVmVarHeap);
    in_RDI[1]._vptr_CVmVarHeap = pp_Var1;
  }
  if (in_RDI[4]._vptr_CVmVarHeap != (_func_int **)0x0) {
    (**(code **)(*in_RDI[4]._vptr_CVmVarHeap + 8))();
  }
  CVmVarHeap::~CVmVarHeap(in_RDI);
  return;
}

Assistant:

CVmVarHeapHybrid::~CVmVarHeapHybrid()
{
    size_t i;
    
    /* delete our cell heaps */
    for (i = 0 ; i < cell_heap_cnt_ ; ++i)
        delete cell_heaps_[i];

    /* delete the cell heap pointer array */
    t3free(cell_heaps_);

    /* delete all of the arrays */
    while (first_array_ != 0)
    {
        CVmVarHeapHybrid_array *nxt;

        /* remember the next one */
        nxt = first_array_->next_array;

        /* delete this one */
        t3free(first_array_);

        /* move on to the next one */
        first_array_ = nxt;
    }

    /* delete the malloc-based subheap manager */
    delete malloc_heap_;
}